

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_LSR_zpzi(DisasContext_conflict1 *s,arg_rpri_esz *a)

{
  arg_rpri_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  if (a->esz < 0) {
    s_local._7_1_ = false;
  }
  else if (a->imm < 8 << ((byte)a->esz & 0x1f)) {
    s_local._7_1_ = do_zpzi_ool(s,a,trans_LSR_zpzi::fns[a->esz]);
  }
  else {
    s_local._7_1_ = do_clr_zp(s,a->rd,a->pg,a->esz);
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_LSR_zpzi(DisasContext *s, arg_rpri_esz *a)
{
    static gen_helper_gvec_3 * const fns[4] = {
        gen_helper_sve_lsr_zpzi_b, gen_helper_sve_lsr_zpzi_h,
        gen_helper_sve_lsr_zpzi_s, gen_helper_sve_lsr_zpzi_d,
    };
    if (a->esz < 0) {
        return false;
    }
    /* Shift by element size is architecturally valid.
       For logical shifts, it is a zeroing operation.  */
    if (a->imm >= (8 << a->esz)) {
        return do_clr_zp(s, a->rd, a->pg, a->esz);
    } else {
        return do_zpzi_ool(s, a, fns[a->esz]);
    }
}